

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.h
# Opt level: O0

IRBuiltinHandler * __thiscall flow::IRProgram::getBuiltinHandler(IRProgram *this,NativeCallback *cb)

{
  bool bVar1;
  reference pvVar2;
  pointer pIVar3;
  Signature *this_00;
  Signature *v;
  undefined1 local_38 [16];
  size_t e;
  size_t i;
  NativeCallback *cb_local;
  IRProgram *this_local;
  
  e = 0;
  i = (size_t)cb;
  cb_local = (NativeCallback *)this;
  local_38._8_8_ =
       std::
       vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
       ::size(&this->builtinHandlers_);
  while( true ) {
    if (e == local_38._8_8_) {
      std::make_unique<flow::IRBuiltinHandler,flow::NativeCallback_const&>
                ((NativeCallback *)local_38);
      std::
      vector<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>,std::allocator<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>>
      ::
      emplace_back<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>
                ((vector<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>,std::allocator<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>>
                  *)&this->builtinHandlers_,
                 (unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_> *
                 )local_38);
      std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>::
      ~unique_ptr((unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
                   *)local_38);
      pvVar2 = std::
               vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
               ::back(&this->builtinHandlers_);
      pIVar3 = std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
               ::get(pvVar2);
      return pIVar3;
    }
    pvVar2 = std::
             vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
             ::operator[](&this->builtinHandlers_,e);
    pIVar3 = std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>::
             operator->(pvVar2);
    this_00 = IRBuiltinHandler::signature(pIVar3);
    v = NativeCallback::signature((NativeCallback *)i);
    bVar1 = Signature::operator==(this_00,v);
    if (bVar1) break;
    e = e + 1;
  }
  pvVar2 = std::
           vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
           ::operator[](&this->builtinHandlers_,e);
  pIVar3 = std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>::
           get(pvVar2);
  return pIVar3;
}

Assistant:

IRBuiltinHandler* getBuiltinHandler(const NativeCallback& cb) {
    for (size_t i = 0, e = builtinHandlers_.size(); i != e; ++i)
      if (builtinHandlers_[i]->signature() == cb.signature())
        return builtinHandlers_[i].get();

    builtinHandlers_.emplace_back(std::make_unique<IRBuiltinHandler>(cb));
    return builtinHandlers_.back().get();
  }